

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * __thiscall MeCab::whatlog::str(whatlog *this)

{
  char *pcVar1;
  long in_RDI;
  string local_28 [40];
  
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 0x178),local_28);
  std::__cxx11::string::~string(local_28);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char *str() {
    str_ = stream_.str();
    return str_.c_str();
  }